

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O3

REF_STATUS ref_smooth_pass(REF_GRID ref_grid)

{
  int *piVar1;
  REF_ADJ pRVar2;
  REF_DBL *pRVar3;
  REF_ADAPT pRVar4;
  REF_NODE pRVar5;
  long lVar6;
  uint neighbor;
  REF_INT neighbor_00;
  uint uVar7;
  REF_STATUS RVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  byte bVar12;
  long lVar13;
  long lVar14;
  undefined8 uVar15;
  REF_STATUS ref_private_macro_code_rxs;
  REF_GEOM pRVar16;
  char *pcVar17;
  REF_INT RVar18;
  REF_NODE pRVar19;
  REF_CELL pRVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  bool bVar24;
  REF_INTERP pRVar25;
  REF_NODE pRVar26;
  double dVar27;
  REF_BOOL allowed;
  REF_DBL max_ratio;
  REF_INT node1;
  REF_DBL tet_quality;
  REF_DBL min_ratio;
  REF_BOOL geom_face;
  REF_BOOL allowed_1;
  REF_INT node0;
  REF_DBL normdev_orig;
  REF_DBL quality;
  REF_BOOL geom_edge;
  REF_DBL normdev;
  REF_DBL ideal [3];
  REF_DBL original [3];
  REF_BOOL geom_node;
  REF_DBL total_force [3];
  uint local_1b4;
  uint local_1a4;
  REF_INTERP local_1a0;
  double local_198;
  uint local_18c;
  REF_NODE local_188;
  double local_180;
  REF_NODE local_178;
  REF_INTERP local_170;
  double local_168;
  int local_160;
  int local_15c;
  REF_CELL local_158;
  REF_GEOM local_150;
  REF_INT local_148 [2];
  undefined8 local_140;
  double local_138;
  int local_12c;
  undefined8 local_128;
  double local_120;
  REF_DBL local_118 [4];
  undefined1 local_f8 [16];
  REF_INT local_e8;
  undefined4 uStack_e4;
  undefined8 uStack_e0;
  REF_DBL local_d8 [3];
  int local_bc;
  double local_b8;
  REF_NODE local_b0;
  REF_DBL local_a8 [15];
  
  pRVar16 = ref_grid->geom;
  lVar11 = 0x28;
  if ((ref_grid->surf == 0) && (ref_grid->twod == 0)) {
    lVar11 = 0x50;
  }
  pRVar19 = ref_grid->node;
  pRVar20 = *(REF_CELL *)((long)ref_grid->cell + lVar11 + -0x10);
  local_158 = pRVar20;
  local_150 = pRVar16;
  if (0 < pRVar16->max) {
    lVar11 = 0;
    local_b0 = pRVar19;
    do {
      if (pRVar16->descr[lVar11 * 6] == 1) {
        uVar9 = pRVar16->descr[lVar11 * 6 + 5];
        uVar7 = ref_geom_is_a(pRVar16,uVar9,0,&local_bc);
        if (uVar7 != 0) {
          pcVar17 = "node check";
          uVar15 = 0x72f;
          goto LAB_001e1d52;
        }
        if (local_bc == 0) {
          lVar23 = (long)(int)uVar9;
          local_188 = (REF_NODE)(ulong)uVar9;
          ref_smooth_local_cell_about(pRVar20,pRVar19,uVar9,(REF_BOOL *)&local_1a4);
          pRVar5 = local_188;
          if (local_1a4 == 0) {
            pRVar19->age[lVar23] = pRVar19->age[lVar23] + 1;
          }
          else {
            iVar10 = (int)local_188;
            if (pRVar16->meshlink == (void *)0x0) {
              uVar7 = ref_smooth_geom_edge(ref_grid,iVar10);
              if (uVar7 != 0) {
                pcVar17 = "ideal node for edge";
                uVar15 = 0x73b;
                goto LAB_001e1d52;
              }
            }
            else {
              if (ref_grid->geom->meshlink == (void *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x35f,"ref_smooth_meshlink_edge_improve","expect meshlink");
LAB_001e1d26:
                uVar21 = 1;
LAB_001e1e72:
                uVar15 = 0x739;
                goto LAB_001e1e93;
              }
              local_178 = ref_grid->node;
              local_e8 = (REF_INT)ref_grid->interp;
              uStack_e4 = (undefined4)((ulong)ref_grid->interp >> 0x20);
              if (((int)uVar9 < 0) ||
                 (((pRVar2 = ref_grid->cell[0]->ref_adj, pRVar16 = local_150, pRVar20 = local_158,
                   pRVar2->nnode <= (int)uVar9 || (pRVar2->first[(long)local_188] == -1)) &&
                  ((pRVar2 = ref_grid->cell[6]->ref_adj, pRVar2->nnode <= iVar10 ||
                   (pRVar2->first[(long)local_188] == -1)))))) {
                uVar7 = ref_geom_is_a(ref_grid->geom,uVar9,1,&local_160);
                if (uVar7 != 0) {
                  pcVar17 = "edge check";
                  uVar15 = 0x367;
                  goto LAB_001e1e68;
                }
                pRVar16 = local_150;
                pRVar20 = local_158;
                if (local_160 != 0) {
                  RVar8 = ref_smooth_edge_neighbors(ref_grid,uVar9,local_148,(REF_INT *)&local_18c);
                  pRVar19 = local_178;
                  neighbor = local_18c;
                  if (RVar8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,0x36a,"ref_smooth_meshlink_edge_improve",1,"edge nodes");
                    goto LAB_001e1d26;
                  }
                  pRVar16 = local_150;
                  pRVar20 = local_158;
                  if (local_18c != 0xffffffff) {
                    local_a8[0] = 0.0;
                    local_a8[1] = 0.0;
                    local_a8[2] = 0.0;
                    uVar7 = ref_smooth_add_pliant_force(local_178,iVar10,local_148[0],local_a8);
                    if (uVar7 == 0) {
                      uVar7 = ref_smooth_add_pliant_force(pRVar19,uVar9,neighbor,local_a8);
                      if (uVar7 == 0) {
                        pRVar3 = pRVar19->real;
                        local_170 = (REF_INTERP)(lVar23 * 0xf);
                        dVar27 = ref_grid->adapt->smooth_pliant_alpha;
                        lVar14 = 0;
                        do {
                          local_118[lVar14] =
                               local_a8[lVar14] * dVar27 + pRVar3[lVar23 * 0xf + lVar14];
                          lVar14 = lVar14 + 1;
                        } while (lVar14 != 3);
                        local_d8[2] = pRVar3[lVar23 * 0xf + 2];
                        local_d8[0] = pRVar3[lVar23 * 0xf];
                        local_d8[1] = (pRVar3 + lVar23 * 0xf)[1];
                        uVar7 = ref_smooth_tri_normdev_around(ref_grid,iVar10,(REF_DBL *)&local_140)
                        ;
                        if (uVar7 == 0) {
                          local_f8._0_4_ = 0xffffffff;
                          lVar14 = CONCAT44(uStack_e4,local_e8);
                          if ((lVar14 != 0) && (*(int *)(lVar14 + 0x34) != 0)) {
                            local_f8._0_4_ = *(undefined4 *)(*(long *)(lVar14 + 0x60) + lVar23 * 4);
                          }
                          local_170 = (REF_INTERP)((long)local_170 << 3);
                          local_1b4 = 0;
                          local_120 = (double)CONCAT44(local_140._4_4_,(int)local_140);
                          iVar22 = 0;
                          pRVar25 = (REF_INTERP)0x3ff0000000000000;
                          do {
                            pRVar3 = pRVar19->real;
                            lVar14 = 0;
                            do {
                              *(double *)((long)pRVar3 + (long)local_170 + lVar14 * 8) =
                                   local_118[lVar14] * (double)pRVar25 +
                                   local_d8[lVar14] * (1.0 - (double)pRVar25);
                              lVar14 = lVar14 + 1;
                            } while (lVar14 != 3);
                            local_1a0 = pRVar25;
                            uVar7 = ref_geom_constrain(ref_grid,iVar10);
                            if (uVar7 != 0) {
                              pcVar17 = "constrain";
                              uVar15 = 0x385;
                              goto LAB_001e1e68;
                            }
                            uVar7 = ref_metric_interpolate_node(ref_grid,iVar10);
                            if ((uVar7 != 0) && (uVar7 != 5)) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                     ,0x387,"ref_smooth_meshlink_edge_improve",(ulong)uVar7,
                                     "ref_metric_interpolate_node failed");
                              local_1b4 = uVar7;
                            }
                            if (uVar7 == 5) {
                              if (local_f8._0_4_ != -1) {
                                *(undefined4 *)
                                 (*(long *)(CONCAT44(uStack_e4,local_e8) + 0x60) + lVar23 * 4) =
                                     local_f8._0_4_;
                              }
                            }
                            else {
                              if (uVar7 != 0) goto LAB_001e04e3;
                              uVar7 = ref_smooth_valid_no_geom_tri(ref_grid,uVar9,&local_15c);
                              if (uVar7 != 0) {
                                pcVar17 = "normals";
                                uVar15 = 0x389;
                                goto LAB_001e1e68;
                              }
                              if (local_15c != 0) {
                                uVar7 = ref_metric_interpolate_node(ref_grid,uVar9);
                                if (uVar7 != 0) {
                                  pcVar17 = "interp node";
                                  uVar15 = 0x38b;
                                  goto LAB_001e1e68;
                                }
                                uVar7 = ref_smooth_tri_quality_around(ref_grid,iVar10,&local_138);
                                if (uVar7 != 0) {
                                  pcVar17 = "q";
                                  uVar15 = 0x38c;
                                  goto LAB_001e1e68;
                                }
                                uVar7 = ref_smooth_tri_ratio_around
                                                  (ref_grid,uVar9,&local_168,&local_198);
                                if (uVar7 != 0) {
                                  pcVar17 = "ratio";
                                  uVar15 = 0x38e;
LAB_001e1cb1:
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                         ,uVar15,"ref_smooth_meshlink_edge_improve",(ulong)uVar7,
                                         pcVar17);
                                  uVar21 = (ulong)uVar7;
                                  goto LAB_001e1e72;
                                }
                                uVar7 = ref_smooth_tri_normdev_around
                                                  (ref_grid,uVar9,(REF_DBL *)&local_128);
                                if (uVar7 != 0) {
                                  pcVar17 = "strand";
                                  uVar15 = 0x38f;
LAB_001e1ce6:
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                         ,uVar15,"ref_smooth_meshlink_edge_improve",(ulong)uVar7,
                                         pcVar17 + 4);
                                  uVar21 = (ulong)uVar7;
                                  goto LAB_001e1e72;
                                }
                                pRVar4 = ref_grid->adapt;
                                if ((((pRVar4->smooth_min_quality <= local_138 &&
                                       local_138 != pRVar4->smooth_min_quality) &&
                                     (pRVar4->post_min_ratio <= local_168)) &&
                                    (local_198 <= pRVar4->post_max_ratio)) &&
                                   ((dVar27 = (double)CONCAT44(local_128._4_4_,(REF_INT)local_128),
                                    pRVar4->post_min_normdev <= dVar27 &&
                                    dVar27 != pRVar4->post_min_normdev || (local_120 < dVar27)))) {
                                  pRVar16 = local_150;
                                  pRVar20 = local_158;
                                  if ((iVar10 < 0) ||
                                     ((pRVar2 = ref_grid->cell[8]->ref_adj, pRVar2->nnode <= iVar10
                                      || (pRVar2->first[(long)pRVar5] == -1)))) goto LAB_001e04ba;
                                  uVar7 = ref_smooth_tet_quality_around(ref_grid,uVar9,&local_180);
                                  if (uVar7 != 0) {
                                    pcVar17 = "q";
                                    uVar15 = 0x39a;
                                    goto LAB_001e1cb1;
                                  }
                                  uVar7 = ref_smooth_tet_ratio_around
                                                    (ref_grid,uVar9,&local_168,&local_198);
                                  if (uVar7 != 0) {
                                    pcVar17 = "add ratio";
                                    uVar15 = 0x39d;
                                    goto LAB_001e1ce6;
                                  }
                                  pRVar4 = ref_grid->adapt;
                                  if (((pRVar4->smooth_min_quality <= local_180 &&
                                        local_180 != pRVar4->smooth_min_quality) &&
                                      (pRVar4->post_min_ratio <= local_168)) &&
                                     (pRVar16 = local_150, pRVar20 = local_158,
                                     local_198 <= pRVar4->post_max_ratio)) goto LAB_001e04ba;
                                }
                              }
                            }
                            pRVar25 = (REF_INTERP)((double)local_1a0 * 0.5);
                            iVar22 = iVar22 + 1;
                            pRVar19 = local_178;
                          } while (iVar22 != 8);
                          pRVar3 = local_178->real;
                          *(REF_DBL *)((long)(pRVar3 + 2) + (long)local_170) = local_d8[2];
                          pRVar3 = (REF_DBL *)((long)pRVar3 + (long)local_170);
                          *pRVar3 = local_d8[0];
                          pRVar3[1] = local_d8[1];
                          uVar9 = ref_metric_interpolate_node(ref_grid,uVar9);
                          if ((uVar9 != 0) && (uVar9 != 5)) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                   ,0x3af,"ref_smooth_meshlink_edge_improve",(ulong)uVar9,"interp");
                            local_1b4 = uVar9;
                          }
                          pRVar16 = local_150;
                          pRVar20 = local_158;
                          if ((uVar9 != 0) && (uVar9 != 5)) {
LAB_001e04e3:
                            uVar21 = (ulong)local_1b4;
                            pRVar16 = local_150;
                            pRVar20 = local_158;
                            if (local_1b4 != 0) goto LAB_001e1e72;
                          }
                          goto LAB_001e04ba;
                        }
                        pcVar17 = "nd_orig";
                        uVar15 = 0x378;
                      }
                      else {
                        pcVar17 = "n1";
                        uVar15 = 0x36f;
                      }
                    }
                    else {
                      pcVar17 = "n0";
                      uVar15 = 0x36e;
                    }
LAB_001e1e68:
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,uVar15,"ref_smooth_meshlink_edge_improve",(ulong)uVar7,pcVar17);
                    uVar21 = (ulong)uVar7;
                    goto LAB_001e1e72;
                  }
                }
              }
            }
LAB_001e04ba:
            local_b0->age[lVar23] = 0;
            pRVar19 = local_b0;
          }
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pRVar16->max);
  }
  if (0 < pRVar19->max) {
    lVar23 = 0;
    lVar11 = 0;
    do {
      if (-1 < pRVar19->global[lVar11]) {
        pRVar2 = ref_grid->cell[0]->ref_adj;
        if (lVar11 < pRVar2->nnode) {
          bVar24 = pRVar2->first[lVar11] != -1;
          local_1a4 = (uint)bVar24;
          if (bVar24) {
            RVar18 = (REF_INT)lVar11;
            uVar7 = ref_geom_is_a(pRVar16,RVar18,1,&local_12c);
            if (uVar7 != 0) {
              pcVar17 = "edge check";
              uVar15 = 0x747;
              goto LAB_001e1d52;
            }
            if (local_12c == 0) {
              ref_smooth_local_cell_about(pRVar20,pRVar19,RVar18,(REF_BOOL *)&local_1a4);
              if (local_1a4 == 0) {
                piVar1 = pRVar19->age + lVar11;
                *piVar1 = *piVar1 + 1;
              }
              else {
                pRVar19->age[lVar11] = 0;
                pRVar2 = ref_grid->cell[0]->ref_adj;
                pRVar16 = local_150;
                pRVar20 = local_158;
                if ((lVar11 < pRVar2->nnode) && (pRVar2->first[lVar11] != -1)) {
                  pRVar5 = ref_grid->node;
                  local_1a0 = ref_grid->interp;
                  pRVar2 = ref_grid->cell[6]->ref_adj;
                  if (((((pRVar2->nnode <= lVar11) || (pRVar2->first[lVar11] == -1)) &&
                       ((pRVar2 = ref_grid->cell[9]->ref_adj, pRVar2->nnode <= lVar11 ||
                        (pRVar2->first[lVar11] == -1)))) &&
                      ((pRVar2 = ref_grid->cell[10]->ref_adj, pRVar2->nnode <= lVar11 ||
                       (pRVar2->first[lVar11] == -1)))) &&
                     ((pRVar2 = ref_grid->cell[0xb]->ref_adj, pRVar2->nnode <= lVar11 ||
                      (pRVar2->first[lVar11] == -1)))) {
                    uVar9 = ref_geom_is_a(ref_grid->geom,RVar18,1,(REF_BOOL *)&local_18c);
                    if (uVar9 != 0) {
                      pcVar17 = "edge check";
                      uVar15 = 0x306;
                      goto LAB_001e1fd7;
                    }
                    pRVar16 = local_150;
                    pRVar20 = local_158;
                    if (local_18c == 0) {
                      RVar8 = ref_smooth_edge_neighbors
                                        (ref_grid,RVar18,(REF_INT *)&local_128,(REF_INT *)&local_140
                                        );
                      neighbor_00 = (REF_INT)local_128;
                      iVar10 = (int)local_140;
                      if (RVar8 == 0) {
                        pRVar16 = local_150;
                        pRVar20 = local_158;
                        if ((int)local_140 == -1) goto LAB_001e0685;
                        uVar9 = ref_smooth_node_same_tangent
                                          ((REF_GRID)ref_grid->node,RVar18,(REF_INT)local_128,
                                           (int)local_140,local_148);
                        if (uVar9 == 0) {
                          pRVar16 = local_150;
                          pRVar20 = local_158;
                          if (local_148[0] == 0) goto LAB_001e0685;
                          local_a8[0] = 0.0;
                          local_a8[1] = 0.0;
                          local_a8[2] = 0.0;
                          uVar9 = ref_smooth_add_pliant_force(pRVar5,RVar18,neighbor_00,local_a8);
                          if (uVar9 == 0) {
                            uVar9 = ref_smooth_add_pliant_force(pRVar5,RVar18,iVar10,local_a8);
                            if (uVar9 == 0) {
                              pRVar3 = pRVar5->real;
                              dVar27 = ref_grid->adapt->smooth_pliant_alpha;
                              lVar14 = 0;
                              do {
                                local_118[lVar14] =
                                     local_a8[lVar14] * dVar27 +
                                     *(double *)((long)pRVar3 + lVar14 * 8 + lVar23);
                                lVar14 = lVar14 + 1;
                              } while (lVar14 != 3);
                              local_170 = (REF_INTERP)(lVar11 * 0x78);
                              local_d8[2] = (pRVar3 + 2)[lVar11 * 0xf];
                              local_d8[0] = pRVar3[lVar11 * 0xf];
                              local_d8[1] = (pRVar3 + lVar11 * 0xf)[1];
                              local_178 = (REF_NODE)CONCAT44(local_178._4_4_,0xffffffff);
                              if ((local_1a0 != (REF_INTERP)0x0) && (local_1a0->continuously != 0))
                              {
                                local_178 = (REF_NODE)
                                            CONCAT44(local_178._4_4_,local_1a0->cell[lVar11]);
                              }
                              local_1b4 = 0;
                              iVar10 = 0;
                              pRVar26 = (REF_NODE)0x3ff0000000000000;
                              do {
                                pRVar3 = pRVar5->real;
                                lVar14 = 0;
                                do {
                                  *(double *)((long)pRVar3 + lVar14 * 8 + lVar23) =
                                       local_118[lVar14] * (double)pRVar26 +
                                       local_d8[lVar14] * (1.0 - (double)pRVar26);
                                  lVar14 = lVar14 + 1;
                                } while (lVar14 != 3);
                                local_188 = pRVar26;
                                uVar9 = ref_metric_interpolate_node(ref_grid,RVar18);
                                if ((uVar9 != 0) && (uVar9 != 5)) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                         ,0x327,"ref_smooth_no_geom_edge_improve",(ulong)uVar9,
                                         "ref_metric_interpolate_node failed");
                                  local_1b4 = uVar9;
                                }
                                if (uVar9 != 5) {
                                  if (uVar9 != 0) goto LAB_001e0aa3;
                                  uVar9 = ref_smooth_valid_no_geom_tri(ref_grid,RVar18,local_148);
                                  if (uVar9 == 0) {
                                    if (local_148[0] == 0) goto LAB_001e0a0f;
                                    uVar9 = ref_metric_interpolate_node(ref_grid,RVar18);
                                    if (uVar9 == 0) {
                                      uVar9 = ref_smooth_tri_quality_around
                                                        (ref_grid,RVar18,&local_138);
                                      if (uVar9 == 0) {
                                        uVar9 = ref_smooth_tri_ratio_around
                                                          (ref_grid,RVar18,&local_168,&local_198);
                                        if (uVar9 == 0) {
                                          pRVar4 = ref_grid->adapt;
                                          if (((local_138 < pRVar4->smooth_min_quality ||
                                                local_138 == pRVar4->smooth_min_quality) ||
                                              (local_168 < pRVar4->post_min_ratio)) ||
                                             (pRVar4->post_max_ratio < local_198))
                                          goto LAB_001e0a0f;
                                          pRVar2 = ref_grid->cell[8]->ref_adj;
                                          pRVar16 = local_150;
                                          pRVar20 = local_158;
                                          if ((pRVar2->nnode <= lVar11) ||
                                             (pRVar2->first[lVar11] == -1)) goto LAB_001e0685;
                                          uVar9 = ref_smooth_tet_quality_around
                                                            (ref_grid,RVar18,&local_180);
                                          if (uVar9 == 0) {
                                            uVar9 = ref_smooth_tet_ratio_around
                                                              (ref_grid,RVar18,&local_168,&local_198
                                                              );
                                            if (uVar9 == 0) {
                                              pRVar4 = ref_grid->adapt;
                                              if (((local_180 < pRVar4->smooth_min_quality ||
                                                    local_180 == pRVar4->smooth_min_quality) ||
                                                  (local_168 < pRVar4->post_min_ratio)) ||
                                                 (pRVar16 = local_150, pRVar20 = local_158,
                                                 pRVar4->post_max_ratio < local_198))
                                              goto LAB_001e0a0f;
                                              goto LAB_001e0685;
                                            }
                                            uVar21 = (ulong)uVar9;
                                            pcVar17 = "ratio";
                                            uVar15 = 0x339;
                                          }
                                          else {
                                            uVar21 = (ulong)uVar9;
                                            pcVar17 = "q";
                                            uVar15 = 0x336;
                                          }
                                        }
                                        else {
                                          uVar21 = (ulong)uVar9;
                                          pcVar17 = "ratio";
                                          uVar15 = 0x32e;
                                        }
                                      }
                                      else {
                                        uVar21 = (ulong)uVar9;
                                        pcVar17 = "q";
                                        uVar15 = 0x32c;
                                      }
                                    }
                                    else {
                                      uVar21 = (ulong)uVar9;
                                      pcVar17 = "interp node";
                                      uVar15 = 0x32b;
                                    }
                                  }
                                  else {
                                    uVar21 = (ulong)uVar9;
                                    pcVar17 = "normals";
                                    uVar15 = 0x329;
                                  }
                                  uVar9 = (uint)uVar21;
                                  goto LAB_001e2170;
                                }
                                if ((int)local_178 != -1) {
                                  local_1a0->cell[lVar11] = (int)local_178;
                                }
LAB_001e0a0f:
                                pRVar26 = (REF_NODE)((double)local_188 * 0.5);
                                iVar10 = iVar10 + 1;
                              } while (iVar10 != 8);
                              pRVar3 = pRVar5->real;
                              *(REF_DBL *)((long)(pRVar3 + 2) + (long)local_170) = local_d8[2];
                              pRVar3 = (REF_DBL *)((long)pRVar3 + (long)local_170);
                              *pRVar3 = local_d8[0];
                              pRVar3[1] = local_d8[1];
                              uVar9 = ref_metric_interpolate_node(ref_grid,RVar18);
                              if ((uVar9 != 0) && (uVar9 != 5)) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                       ,0x34b,"ref_smooth_no_geom_edge_improve",(ulong)uVar9,
                                       "interp");
                                local_1b4 = uVar9;
                              }
                              pRVar16 = local_150;
                              pRVar20 = local_158;
                              if ((uVar9 != 5) && (uVar9 != 0)) {
LAB_001e0aa3:
                                uVar21 = (ulong)local_1b4;
                                pRVar16 = local_150;
                                pRVar20 = local_158;
                                if (local_1b4 != 0) goto LAB_001e217a;
                              }
                              goto LAB_001e0685;
                            }
                            pcVar17 = "n1";
                            uVar15 = 0x311;
                          }
                          else {
                            pcVar17 = "n0";
                            uVar15 = 0x310;
                          }
                        }
                        else {
                          pcVar17 = "tan";
                          uVar15 = 0x30c;
                        }
LAB_001e1fd7:
                        uVar21 = (ulong)uVar9;
LAB_001e2170:
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                               ,uVar15,"ref_smooth_no_geom_edge_improve",uVar21,pcVar17);
                        uVar21 = (ulong)uVar9;
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                               ,0x309,"ref_smooth_no_geom_edge_improve",1,"edge nodes");
                        uVar21 = 1;
                      }
LAB_001e217a:
                      uVar15 = 0x752;
LAB_001e1e93:
                      pcVar17 = "improve";
                      uVar7 = (uint)uVar21;
                      goto LAB_001e223e;
                    }
                  }
                }
              }
            }
          }
        }
        else {
          local_1a4 = 0;
        }
      }
LAB_001e0685:
      lVar11 = lVar11 + 1;
      lVar23 = lVar23 + 0x78;
    } while (lVar11 < pRVar19->max);
  }
  if (0 < ref_grid->adapt->timing_level) {
    ref_mpi_stopwatch_stop(ref_grid->mpi,"mov edge");
  }
  if (pRVar16->max < 1) {
LAB_001e113a:
    iVar10 = pRVar19->max;
    if (0 < iVar10) {
      lVar11 = 0;
      uVar21 = 0;
      do {
        if ((-1 < pRVar19->global[uVar21]) &&
           ((pRVar2 = ref_grid->cell[0]->ref_adj, (long)pRVar2->nnode <= (long)uVar21 ||
            (bVar24 = pRVar2->first[uVar21] == -1, local_1a4 = (uint)bVar24, bVar24)))) {
          pRVar2 = ref_grid->cell[3]->ref_adj;
          if ((long)uVar21 < (long)pRVar2->nnode) {
            bVar24 = pRVar2->first[uVar21] != -1;
            local_1a4 = (uint)bVar24;
            if (bVar24) {
              RVar18 = (REF_INT)uVar21;
              uVar7 = ref_geom_is_a(pRVar16,RVar18,2,&local_160);
              if (uVar7 != 0) {
                pcVar17 = "face check";
                uVar15 = 0x77a;
                goto LAB_001e1d52;
              }
              if (local_160 == 0) {
                ref_smooth_local_cell_about(pRVar20,pRVar19,RVar18,(REF_BOOL *)&local_1a4);
                if (local_1a4 == 0) {
                  pRVar19->age[uVar21] = pRVar19->age[uVar21] + 1;
                }
                else {
                  pRVar5 = ref_grid->node;
                  pRVar2 = ref_grid->cell[6]->ref_adj;
                  pRVar16 = local_150;
                  pRVar20 = local_158;
                  if ((((((long)pRVar2->nnode <= (long)uVar21) || (pRVar2->first[uVar21] == -1)) &&
                       ((pRVar2 = ref_grid->cell[9]->ref_adj, (long)pRVar2->nnode <= (long)uVar21 ||
                        (pRVar2->first[uVar21] == -1)))) &&
                      (((pRVar2 = ref_grid->cell[10]->ref_adj, (long)pRVar2->nnode <= (long)uVar21
                        || (pRVar2->first[uVar21] == -1)) &&
                       ((pRVar2 = ref_grid->cell[0xb]->ref_adj, (long)pRVar2->nnode <= (long)uVar21
                        || (pRVar2->first[uVar21] == -1)))))) &&
                     ((pRVar2 = ref_grid->cell[0]->ref_adj, (long)pRVar2->nnode <= (long)uVar21 ||
                      (pRVar2->first[uVar21] == -1)))) {
                    local_1a0 = ref_grid->interp;
                    local_1b4 = ref_cell_id_list_around
                                          (ref_grid->cell[3],RVar18,2,(REF_INT *)&local_140,
                                           (REF_INT *)&local_128);
                    if ((local_1b4 == 0) || (local_1b4 == 7)) {
                      pRVar16 = local_150;
                      pRVar20 = local_158;
                      if (1 < (int)local_140) goto LAB_001e1313;
                      local_188 = pRVar5;
                      uVar7 = ref_geom_is_a(ref_grid->geom,RVar18,2,&local_15c);
                      if (uVar7 == 0) {
                        pRVar16 = local_150;
                        pRVar20 = local_158;
                        if (local_15c != 0) goto LAB_001e1313;
                        uVar7 = ref_smooth_node_same_normal
                                          ((REF_GRID)ref_grid->node,(REF_INT)ref_grid->cell[3],
                                           (REF_BOOL *)(uVar21 & 0xffffffff));
                        if (uVar7 == 0) {
                          pRVar16 = local_150;
                          pRVar20 = local_158;
                          if (local_148[0] == 0) goto LAB_001e1313;
                          local_118[2] = local_188->real[uVar21 * 0xf + 2];
                          pRVar3 = local_188->real + uVar21 * 0xf;
                          local_118[0] = *pRVar3;
                          local_118[1] = pRVar3[1];
                          local_178 = (REF_NODE)CONCAT44(local_178._4_4_,0xffffffff);
                          if ((local_1a0 != (REF_INTERP)0x0) && (local_1a0->continuously != 0)) {
                            local_178 = (REF_NODE)CONCAT44(local_178._4_4_,local_1a0->cell[uVar21]);
                          }
                          uVar7 = ref_smooth_tri_quality_around(ref_grid,RVar18,local_d8);
                          if (uVar7 == 0) {
                            uVar7 = ref_smooth_tri_ratio_around
                                              (ref_grid,RVar18,&local_198,&local_180);
                            if (uVar7 == 0) {
                              local_e8 = SUB84(local_d8[0],0);
                              uStack_e4 = (undefined4)((ulong)local_d8[0] >> 0x20);
                              uStack_e0 = 0;
                              bVar12 = local_180 < 2.0 & -(0.5 < local_198) & -(0.5 < local_d8[0]);
                              local_170 = (REF_INTERP)CONCAT71(local_170._1_7_,bVar12);
                              local_120 = (double)(uVar21 * 0x78);
                              if (bVar12 == 1) {
                                uVar7 = ref_smooth_tri_pliant(ref_grid,RVar18,local_a8);
                                if (uVar7 == 0) {
LAB_001e1462:
                                  local_f8._8_4_ = (int)uStack_e0;
                                  local_f8._0_8_ = (double)CONCAT44(uStack_e4,local_e8) * 0.9;
                                  local_f8._12_4_ = (int)((ulong)uStack_e0 >> 0x20);
                                  iVar10 = 0;
                                  dVar27 = 1.0;
                                  do {
                                    pRVar3 = local_188->real;
                                    lVar23 = 0;
                                    do {
                                      *(double *)((long)pRVar3 + lVar23 * 8 + lVar11) =
                                           local_a8[lVar23] * dVar27 +
                                           local_118[lVar23] * (1.0 - dVar27);
                                      lVar23 = lVar23 + 1;
                                    } while (lVar23 != 3);
                                    uVar9 = ref_metric_interpolate_node(ref_grid,RVar18);
                                    if ((uVar9 != 0) && (uVar9 != 5)) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                             ,0x43a,"ref_smooth_no_geom_tri_improve",(ulong)uVar9,
                                             "ref_metric_interpolate_node failed");
                                      local_1b4 = uVar9;
                                    }
                                    if (uVar9 == 5) {
                                      if ((int)local_178 != -1) {
                                        local_1a0->cell[uVar21] = (int)local_178;
                                      }
                                      goto LAB_001e1705;
                                    }
                                    if (uVar9 != 0) goto LAB_001e1797;
                                    uVar7 = ref_smooth_tri_quality_around
                                                      (ref_grid,RVar18,&local_138);
                                    if (uVar7 != 0) {
                                      pcVar17 = "q";
                                      uVar15 = 0x43c;
                                      goto LAB_001e2411;
                                    }
                                    uVar7 = ref_smooth_tri_ratio_around
                                                      (ref_grid,RVar18,&local_198,&local_180);
                                    if (uVar7 != 0) {
                                      pcVar17 = "ratio";
                                      uVar15 = 0x43e;
                                      goto LAB_001e2411;
                                    }
                                    uVar7 = ref_smooth_valid_no_geom_tri
                                                      (ref_grid,RVar18,(REF_BOOL *)&local_18c);
                                    if (uVar7 != 0) {
                                      pcVar17 = "twod tri";
                                      uVar15 = 0x440;
                                      goto LAB_001e2411;
                                    }
                                    if (local_18c == 0) {
                                      bVar24 = false;
                                    }
                                    else if (ref_grid->adapt->post_min_ratio <= local_198) {
                                      bVar24 = local_180 <= ref_grid->adapt->post_max_ratio;
                                    }
                                    else {
                                      bVar24 = false;
                                    }
                                    if ((char)local_170 == '\0') {
                                      bVar12 = bVar24 & ((double)CONCAT44(uStack_e4,local_e8) <=
                                                         local_138 &&
                                                        local_138 !=
                                                        (double)CONCAT44(uStack_e4,local_e8));
                                      local_18c = (uint)bVar12;
                                      if (bVar12 != 0) goto LAB_001e1670;
                                    }
                                    else {
                                      bVar12 = bVar24 & -((double)local_f8._0_8_ < local_138) &
                                                        -(0.4 < local_138);
                                      local_18c = (uint)bVar12;
                                      if (bVar12 == 1) {
LAB_001e1670:
                                        pRVar2 = ref_grid->cell[8]->ref_adj;
                                        pRVar16 = local_150;
                                        pRVar20 = local_158;
                                        if (((long)pRVar2->nnode <= (long)uVar21) ||
                                           (pRVar2->first[uVar21] == -1)) goto LAB_001e1313;
                                        uVar7 = ref_smooth_tet_quality_around
                                                          (ref_grid,RVar18,&local_168);
                                        if (uVar7 != 0) {
                                          pcVar17 = "q";
                                          uVar15 = 0x451;
                                          goto LAB_001e2411;
                                        }
                                        uVar7 = ref_smooth_tet_ratio_around
                                                          (ref_grid,RVar18,&local_198,&local_180);
                                        if (uVar7 != 0) {
                                          pcVar17 = "ratio";
                                          uVar15 = 0x454;
                                          goto LAB_001e2411;
                                        }
                                        pRVar4 = ref_grid->adapt;
                                        if (((pRVar4->smooth_min_quality <= local_168 &&
                                              local_168 != pRVar4->smooth_min_quality) &&
                                            (pRVar4->post_min_ratio <= local_198)) &&
                                           (pRVar16 = local_150, pRVar20 = local_158,
                                           local_180 <= pRVar4->post_max_ratio)) goto LAB_001e1313;
                                      }
                                    }
LAB_001e1705:
                                    dVar27 = dVar27 * 0.5;
                                    iVar10 = iVar10 + 1;
                                  } while (iVar10 != 8);
                                  pRVar3 = local_188->real;
                                  *(REF_DBL *)((long)pRVar3 + (long)local_120 + 0x10) = local_118[2]
                                  ;
                                  pRVar3 = (REF_DBL *)((long)pRVar3 + (long)local_120);
                                  *pRVar3 = local_118[0];
                                  pRVar3[1] = local_118[1];
                                  uVar9 = ref_metric_interpolate_node(ref_grid,RVar18);
                                  if ((uVar9 != 0) && (uVar9 != 5)) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                           ,0x465,"ref_smooth_no_geom_tri_improve",(ulong)uVar9,
                                           "interp");
                                    local_1b4 = uVar9;
                                  }
                                  pRVar16 = local_150;
                                  pRVar20 = local_158;
                                  if ((uVar9 != 5) && (uVar9 != 0)) {
LAB_001e1797:
                                    pRVar16 = local_150;
                                    pRVar20 = local_158;
                                    if (local_1b4 != 0) {
                                      pcVar17 = "no geom smooth";
                                      uVar15 = 0x783;
LAB_001e112a:
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                                             ,uVar15,"ref_smooth_pass",(ulong)local_1b4,pcVar17);
                                      return local_1b4;
                                    }
                                  }
                                  goto LAB_001e1313;
                                }
                                pcVar17 = "ideal";
                                uVar15 = 0x42f;
                              }
                              else {
                                uVar7 = ref_smooth_tri_weighted_ideal(ref_grid,RVar18,local_a8);
                                if (uVar7 == 0) goto LAB_001e1462;
                                pcVar17 = "ideal";
                                uVar15 = 0x431;
                              }
                            }
                            else {
                              pcVar17 = "ratio";
                              uVar15 = 0x42b;
                            }
                          }
                          else {
                            pcVar17 = "q";
                            uVar15 = 0x429;
                          }
                        }
                        else {
                          pcVar17 = "normal dev";
                          uVar15 = 0x41d;
                        }
                      }
                      else {
                        pcVar17 = "face check";
                        uVar15 = 0x41a;
                      }
                    }
                    else {
                      pcVar17 = "count faceids";
                      uVar15 = 0x415;
                      uVar7 = local_1b4;
                    }
LAB_001e2411:
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,uVar15,"ref_smooth_no_geom_tri_improve",(ulong)uVar7,pcVar17);
                    pcVar17 = "no geom smooth";
                    uVar15 = 0x783;
                    goto LAB_001e223b;
                  }
                }
              }
            }
          }
          else {
            local_1a4 = 0;
          }
        }
LAB_001e1313:
        uVar21 = uVar21 + 1;
        iVar10 = pRVar19->max;
        lVar11 = lVar11 + 0x78;
      } while ((long)uVar21 < (long)iVar10);
    }
    if (0 < ref_grid->adapt->timing_level) {
      ref_mpi_stopwatch_stop(ref_grid->mpi,"mov face");
      iVar10 = pRVar19->max;
    }
    if (0 < iVar10) {
      pRVar20 = ref_grid->cell[8];
      lVar11 = 0;
      do {
        if (-1 < pRVar19->global[lVar11]) {
          ref_smooth_local_cell_about(pRVar20,pRVar19,(REF_INT)lVar11,(REF_BOOL *)&local_1a4);
          if (local_1a4 == 0) {
            pRVar19->age[lVar11] = pRVar19->age[lVar11] + 1;
          }
          else {
            pRVar2 = ref_grid->cell[3]->ref_adj;
            if ((((pRVar2->nnode <= lVar11) || (pRVar2->first[lVar11] == -1)) &&
                ((pRVar2 = ref_grid->cell[6]->ref_adj, pRVar2->nnode <= lVar11 ||
                 (pRVar2->first[lVar11] == -1)))) &&
               ((pRVar2 = ref_grid->cell[8]->ref_adj, lVar11 < pRVar2->nnode &&
                (pRVar2->first[lVar11] != -1)))) {
              uVar7 = ref_smooth_tet_improve(ref_grid,(REF_INT)lVar11);
              if (uVar7 != 0) {
                pcVar17 = "ideal tet node";
                uVar15 = 0x79a;
LAB_001e1d52:
                uVar21 = (ulong)uVar7;
                goto LAB_001e223e;
              }
              pRVar19->age[lVar11] = 0;
            }
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < pRVar19->max);
    }
    if (0 < ref_grid->adapt->timing_level) {
      ref_mpi_stopwatch_stop(ref_grid->mpi,"mov int");
    }
    if ((ref_grid->surf == 0) && (pRVar20 = ref_grid->cell[8], 0 < pRVar20->max)) {
      iVar10 = 0;
      do {
        RVar8 = ref_cell_nodes(pRVar20,iVar10,(REF_INT *)local_a8);
        if (RVar8 == 0) {
          uVar7 = ref_node_tet_quality(pRVar19,(REF_INT *)local_a8,local_118);
          if (uVar7 != 0) {
            pcVar17 = "qual";
            uVar15 = 0x7ab;
LAB_001e223b:
            uVar21 = (ulong)uVar7;
LAB_001e223e:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,uVar15,"ref_smooth_pass",uVar21,pcVar17);
            return uVar7;
          }
          if ((local_118[0] < 0.1) && (0 < pRVar20->node_per)) {
            lVar11 = 0;
            do {
              uVar9 = *(uint *)((long)local_a8 + lVar11 * 4);
              ref_smooth_local_cell_about(pRVar20,pRVar19,uVar9,(REF_BOOL *)&local_1a4);
              if (local_1a4 == 0) {
                pRVar19->age[(int)uVar9] = pRVar19->age[(int)uVar9] + 1;
              }
              else if (((int)uVar9 < 0) ||
                      (((pRVar2 = ref_grid->cell[3]->ref_adj, pRVar2->nnode <= (int)uVar9 ||
                        (pRVar2->first[uVar9] == -1)) &&
                       ((pRVar2 = ref_grid->cell[6]->ref_adj, pRVar2->nnode <= (int)uVar9 ||
                        (pRVar2->first[uVar9] == -1)))))) {
                uVar7 = ref_smooth_tet_improve(ref_grid,uVar9);
                if (uVar7 != 0) {
                  pcVar17 = "ideal";
                  uVar15 = 0x7b9;
                  goto LAB_001e223b;
                }
                pRVar19->age[(int)uVar9] = 0;
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < pRVar20->node_per);
          }
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < pRVar20->max);
    }
    return 0;
  }
  lVar11 = 0;
LAB_001e0aea:
  if (pRVar16->descr[lVar11 * 6] != 2) goto LAB_001e10e3;
  uVar9 = pRVar16->descr[lVar11 * 6 + 5];
  uVar7 = ref_geom_is_a(pRVar16,uVar9,1,&local_12c);
  if (uVar7 != 0) {
    pcVar17 = "edge check";
    uVar15 = 0x75e;
    goto LAB_001e1d52;
  }
  if (local_12c != 0) goto LAB_001e10e3;
  lVar23 = (long)(int)uVar9;
  ref_smooth_local_cell_about(pRVar20,pRVar19,uVar9,(REF_BOOL *)&local_1a4);
  if (local_1a4 == 0) {
    pRVar19->age[lVar23] = pRVar19->age[lVar23] + 1;
    pRVar20 = local_158;
    goto LAB_001e10e3;
  }
  if (pRVar16->meshlink == (void *)0x0) {
    uVar7 = ref_smooth_geom_face(ref_grid,uVar9);
    if (uVar7 != 0) {
      pcVar17 = "ideal node for face";
      uVar15 = 0x76a;
      goto LAB_001e1d52;
    }
LAB_001e10d3:
    pRVar19->age[lVar23] = 0;
    pRVar20 = local_158;
LAB_001e10e3:
    lVar11 = lVar11 + 1;
    if (pRVar16->max <= lVar11) goto LAB_001e113a;
    goto LAB_001e0aea;
  }
  if (ref_grid->geom->meshlink == (void *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x478,
           "ref_smooth_meshlink_face_improve","expect meshlink");
    uVar7 = 1;
    goto LAB_001e221a;
  }
  pRVar5 = ref_grid->node;
  local_170 = ref_grid->interp;
  if ((-1 < (int)uVar9) &&
     (((pRVar2 = ref_grid->cell[6]->ref_adj, pRVar16 = local_150, (int)uVar9 < pRVar2->nnode &&
       (pRVar2->first[uVar9] != -1)) ||
      ((pRVar2 = ref_grid->cell[0]->ref_adj, (int)uVar9 < pRVar2->nnode &&
       (pRVar2->first[uVar9] != -1)))))) goto LAB_001e10d3;
  local_1b4 = ref_cell_id_list_around(ref_grid->cell[3],uVar9,2,(REF_INT *)&local_18c,local_148);
  if ((local_1b4 == 0) || (local_1b4 == 7)) {
    pRVar16 = local_150;
    if (1 < (int)local_18c) goto LAB_001e10d3;
    uVar7 = ref_geom_is_a(ref_grid->geom,uVar9,2,&local_160);
    if (uVar7 == 0) {
      pRVar16 = local_150;
      if (local_160 == 0) goto LAB_001e10d3;
      local_f8._0_8_ = pRVar5;
      pRVar3 = pRVar5->real;
      local_178 = (REF_NODE)(lVar23 * 0xf);
      local_118[2] = pRVar3[lVar23 * 0xf + 2];
      pRVar3 = pRVar3 + lVar23 * 0xf;
      local_118[0] = *pRVar3;
      local_118[1] = pRVar3[1];
      local_e8 = -1;
      if ((local_170 != (REF_INTERP)0x0) && (local_170->continuously != 0)) {
        local_e8 = local_170->cell[lVar23];
      }
      uVar7 = ref_smooth_tri_quality_around(ref_grid,uVar9,local_d8);
      if (uVar7 == 0) {
        uVar7 = ref_smooth_tri_normdev_around(ref_grid,uVar9,(REF_DBL *)&local_140);
        if (uVar7 == 0) {
          uVar7 = ref_smooth_tri_ratio_around(ref_grid,uVar9,&local_198,&local_180);
          if (uVar7 == 0) {
            local_120 = local_d8[0];
            if (((local_d8[0] < 0.5) || (local_198 < 0.5)) || (2.0 < local_180)) {
              uVar7 = ref_smooth_tri_weighted_ideal(ref_grid,uVar9,local_a8);
              lVar14 = local_f8._0_8_;
              if (uVar7 == 0) goto LAB_001e0da1;
              pcVar17 = "ideal";
              uVar15 = 0x498;
            }
            else {
              uVar7 = ref_smooth_tri_pliant(ref_grid,uVar9,local_a8);
              lVar14 = local_f8._0_8_;
              if (uVar7 == 0) {
LAB_001e0da1:
                local_178 = (REF_NODE)((long)local_178 << 3);
                iVar10 = 0;
                local_b8 = (double)CONCAT44(local_140._4_4_,(int)local_140);
                pRVar25 = (REF_INTERP)0x3ff0000000000000;
                do {
                  local_188 = (REF_NODE)CONCAT44(local_188._4_4_,iVar10);
                  lVar6 = *(long *)(lVar14 + 0x38);
                  lVar13 = 0;
                  do {
                    *(double *)((long)&local_178->n + lVar13 * 8 + lVar6) =
                         local_a8[lVar13] * (double)pRVar25 +
                         local_118[lVar13] * (1.0 - (double)pRVar25);
                    lVar13 = lVar13 + 1;
                  } while (lVar13 != 3);
                  local_1a0 = pRVar25;
                  uVar7 = ref_geom_constrain(ref_grid,uVar9);
                  if (uVar7 != 0) {
                    pcVar17 = "constrain";
                    uVar15 = 0x4a2;
                    goto LAB_001e2213;
                  }
                  uVar7 = ref_metric_interpolate_node(ref_grid,uVar9);
                  if ((uVar7 != 0) && (uVar7 != 5)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                           ,0x4a4,"ref_smooth_meshlink_face_improve",(ulong)uVar7,
                           "ref_metric_interpolate_node failed");
                    local_1b4 = uVar7;
                  }
                  if (uVar7 == 5) {
                    if (local_e8 != -1) {
                      local_170->cell[lVar23] = local_e8;
                    }
                  }
                  else {
                    if (uVar7 != 0) goto LAB_001e10f5;
                    uVar7 = ref_smooth_valid_no_geom_tri(ref_grid,uVar9,&local_15c);
                    if (uVar7 != 0) {
                      pcVar17 = "twod tri";
                      uVar15 = 0x4a6;
                      goto LAB_001e2213;
                    }
                    uVar7 = ref_smooth_tri_quality_around(ref_grid,uVar9,&local_138);
                    if (uVar7 != 0) {
                      pcVar17 = "q";
                      uVar15 = 0x4a7;
                      goto LAB_001e2213;
                    }
                    uVar7 = ref_smooth_tri_normdev_around(ref_grid,uVar9,(REF_DBL *)&local_128);
                    if (uVar7 != 0) {
                      pcVar17 = "nd";
                      uVar15 = 0x4a8;
                      goto LAB_001e2213;
                    }
                    uVar7 = ref_smooth_tri_ratio_around(ref_grid,uVar9,&local_198,&local_180);
                    if (uVar7 != 0) {
                      pcVar17 = "ratio";
                      uVar15 = 0x4aa;
                      goto LAB_001e2213;
                    }
                    lVar14 = local_f8._0_8_;
                    if ((((local_15c != 0) && (local_120 < local_138)) &&
                        ((pRVar4 = ref_grid->adapt, pRVar4->post_min_ratio <= local_198 &&
                         (local_180 <= pRVar4->post_max_ratio)))) &&
                       ((dVar27 = (double)CONCAT44(local_128._4_4_,(REF_INT)local_128),
                        pRVar4->post_min_normdev <= dVar27 && dVar27 != pRVar4->post_min_normdev ||
                        (local_b8 < dVar27)))) {
                      pRVar16 = local_150;
                      if (((int)uVar9 < 0) ||
                         ((pRVar2 = ref_grid->cell[8]->ref_adj, pRVar2->nnode <= (int)uVar9 ||
                          (pRVar2->first[uVar9] == -1)))) goto LAB_001e10d3;
                      uVar7 = ref_smooth_tet_quality_around(ref_grid,uVar9,&local_168);
                      if (uVar7 != 0) {
                        pcVar17 = "q";
                        uVar15 = 0x4b3;
                        goto LAB_001e2213;
                      }
                      uVar7 = ref_smooth_tet_ratio_around(ref_grid,uVar9,&local_198,&local_180);
                      if (uVar7 != 0) {
                        pcVar17 = "ratio";
                        uVar15 = 0x4b6;
                        goto LAB_001e2213;
                      }
                      pRVar4 = ref_grid->adapt;
                      if (((pRVar4->smooth_min_quality <= local_168 &&
                            local_168 != pRVar4->smooth_min_quality) &&
                          (pRVar4->post_min_ratio <= local_198)) &&
                         (pRVar16 = local_150, local_180 <= pRVar4->post_max_ratio))
                      goto LAB_001e10d3;
                    }
                  }
                  pRVar25 = (REF_INTERP)((double)local_1a0 * 0.5);
                  iVar10 = (int)local_188 + 1;
                } while (iVar10 != 8);
                lVar14 = *(long *)(lVar14 + 0x38);
                *(REF_DBL *)((long)&local_178->global + lVar14) = local_118[2];
                pRVar3 = (REF_DBL *)((long)&local_178->n + lVar14);
                *pRVar3 = local_118[0];
                pRVar3[1] = local_118[1];
                uVar9 = ref_metric_interpolate_node(ref_grid,uVar9);
                if ((uVar9 != 0) && (uVar9 != 5)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x4c7,"ref_smooth_meshlink_face_improve",(ulong)uVar9,"interp");
                  local_1b4 = uVar9;
                }
                pRVar16 = local_150;
                if ((uVar9 != 5) && (uVar9 != 0)) {
LAB_001e10f5:
                  pRVar16 = local_150;
                  if (local_1b4 == 0) goto LAB_001e10d3;
                  pcVar17 = "improve";
                  uVar15 = 0x768;
                  goto LAB_001e112a;
                }
                goto LAB_001e10d3;
              }
              pcVar17 = "ideal";
              uVar15 = 0x49a;
            }
          }
          else {
            pcVar17 = "ratio";
            uVar15 = 0x495;
          }
        }
        else {
          pcVar17 = "nd_orig";
          uVar15 = 0x493;
        }
      }
      else {
        pcVar17 = "q";
        uVar15 = 0x492;
      }
    }
    else {
      pcVar17 = "face check";
      uVar15 = 0x486;
    }
  }
  else {
    pcVar17 = "count faceids";
    uVar15 = 0x481;
    uVar7 = local_1b4;
  }
LAB_001e2213:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar15,
         "ref_smooth_meshlink_face_improve",(ulong)uVar7,pcVar17);
LAB_001e221a:
  pcVar17 = "improve";
  uVar15 = 0x768;
  goto LAB_001e223b;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_pass(REF_GRID ref_grid) {
  REF_CELL ref_cell;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT geom, node;
  REF_BOOL allowed, geom_node, geom_edge, geom_face, interior;
  REF_BOOL vol_val = REF_FALSE;

  if (ref_grid_surf(ref_grid) || ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol start");

  /* smooth edges first if we have geom */
  each_ref_geom_edge(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    /* don't move geom nodes */
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &geom_node), "node check");
    if (geom_node) continue;
    /* next to ghost node, can't move */
    RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
        "para");
    if (!allowed) {
      ref_node_age(ref_node, node)++;
      continue;
    }
    if (ref_geom_meshlinked(ref_geom)) {
      RSS(ref_smooth_meshlink_edge_improve(ref_grid, node), "improve");
    } else {
      RSS(ref_smooth_geom_edge(ref_grid, node), "ideal node for edge");
    }
    ref_node_age(ref_node, node) = 0;
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol geom edge");

  /* smooth edges first without geom, for 2D */
  each_ref_node_valid_node(ref_node, node) {
    /* boundaries only */
    allowed = !ref_cell_node_empty(ref_grid_edg(ref_grid), node);
    if (!allowed) continue;
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &geom_edge), "edge check");
    if (geom_edge) continue;

    RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
        "para");
    if (!allowed) {
      ref_node_age(ref_node, node)++;
      continue;
    }

    ref_node_age(ref_node, node) = 0;
    RSS(ref_smooth_no_geom_edge_improve(ref_grid, node), "improve");
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol nogeom edge");

  if (ref_grid_adapt(ref_grid, timing_level) > 0)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "mov edge");

  /* smooth faces if we have geom, but skip edges */
  each_ref_geom_face(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    /* don't move geom nodes */
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &geom_edge), "edge check");
    if (geom_edge) continue;
    /* next to ghost node, can't move */
    RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
        "para");
    if (!allowed) {
      ref_node_age(ref_node, node)++;
      continue;
    }
    if (ref_geom_meshlinked(ref_geom)) {
      RSS(ref_smooth_meshlink_face_improve(ref_grid, node), "improve");
    } else {
      RSS(ref_smooth_geom_face(ref_grid, node), "ideal node for face");
    }
    ref_node_age(ref_node, node) = 0;
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol face geom");

  /* smooth faces without geom */
  each_ref_node_valid_node(ref_node, node) {
    /* avoid edges */
    allowed = ref_cell_node_empty(ref_grid_edg(ref_grid), node);
    if (!allowed) continue;
    /* need tri to smooth */
    allowed = !ref_cell_node_empty(ref_grid_tri(ref_grid), node);
    if (!allowed) continue;
    /* avoid geometry faces (or edges) */
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_FACE, &geom_face), "face check");
    if (geom_face) continue;

    RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
        "para");
    if (!allowed) {
      ref_node_age(ref_node, node)++;
      continue;
    }
    RSS(ref_smooth_no_geom_tri_improve(ref_grid, node), "no geom smooth");
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol face nogeom");

  if (ref_grid_adapt(ref_grid, timing_level) > 0)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "mov face");

  /* smooth interior */
  ref_cell = ref_grid_tet(ref_grid);

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
        "para");
    if (!allowed) {
      ref_node_age(ref_node, node)++;
      continue;
    }

    interior = ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
               ref_cell_node_empty(ref_grid_qua(ref_grid), node) &&
               !ref_cell_node_empty(ref_grid_tet(ref_grid), node);
    if (interior) {
      RSS(ref_smooth_tet_improve(ref_grid, node), "ideal tet node");
      ref_node_age(ref_node, node) = 0;
    }
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol int");

  if (ref_grid_adapt(ref_grid, timing_level) > 0)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "mov int");

  /* smooth low quality tets */
  ref_cell = ref_grid_tet(ref_grid);

  if (!ref_grid_surf(ref_grid)) {
    REF_DBL quality, min_quality = 0.10;
    REF_INT cell, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
      if (quality < min_quality) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          node = nodes[cell_node];
          RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
              "para");
          if (!allowed) {
            ref_node_age(ref_node, node)++;
            continue;
          }

          interior = ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
                     ref_cell_node_empty(ref_grid_qua(ref_grid), node);
          if (interior) {
            RSS(ref_smooth_tet_improve(ref_grid, node), "ideal");
            ref_node_age(ref_node, node) = 0;
          }
        }
      }
    }
    if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol about");
  }
  return REF_SUCCESS;
}